

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O3

int si9ma::DP::save_money_recursive(int *arr,int length,int index,int target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int target_00;
  
  uVar4 = 0;
  if (-1 < target && arr != (int *)0x0) {
    if (index == length) {
      uVar4 = (uint)(target == 0);
    }
    else if (target == 0) {
      uVar4 = 1;
    }
    else {
      iVar1 = arr[index];
      iVar3 = 0;
      uVar4 = 0;
      target_00 = target;
      do {
        iVar2 = save_money_recursive(arr,length,index + 1,target_00);
        uVar4 = uVar4 + iVar2;
        target_00 = target_00 - iVar1;
        iVar3 = iVar3 + iVar1;
      } while (iVar3 <= target);
    }
  }
  return uVar4;
}

Assistant:

int DP::save_money_recursive(int *arr,int length,int index,int target) {
        if (arr == nullptr || target < 0)
            return 0;

        if (index == length)
            return target == 0;

        if (target == 0)
            return 1;

        int res = 0;
        for (int i = 0; i * arr[index] <= target; ++i) {
            res += save_money_recursive(arr,length,index + 1,target - i*arr[index]);
        }

        return res;
    }